

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O0

timer_element * remove_timer(timer_element **base,short func_index,void *arg)

{
  timer_element *local_30;
  timer_element *curr;
  timer_element *prev;
  void *arg_local;
  short func_index_local;
  timer_element **base_local;
  
  curr = (timer_element *)0x0;
  for (local_30 = *base;
      (local_30 != (timer_element *)0x0 &&
      (((ushort)local_30->func_index != func_index || (local_30->arg != arg))));
      local_30 = local_30->next) {
    curr = local_30;
  }
  if (local_30 != (timer_element *)0x0) {
    if (curr == (timer_element *)0x0) {
      *base = local_30->next;
    }
    else {
      curr->next = local_30->next;
    }
  }
  return local_30;
}

Assistant:

static timer_element *remove_timer(timer_element **base, short func_index,
				   void * arg)
{
    timer_element *prev, *curr;

    for (prev = 0, curr = *base; curr; prev = curr, curr = curr->next)
	if (curr->func_index == func_index && curr->arg == arg) break;

    if (curr) {
	if (prev)
	    prev->next = curr->next;
	else
	    *base = curr->next;
    }

    return curr;
}